

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerMemUsed(Pager *pPager)

{
  ushort uVar1;
  i64 iVar2;
  int iVar3;
  int iVar4;
  int perPageSize;
  Pager *pPager_local;
  
  iVar2 = pPager->pageSize;
  uVar1 = pPager->nExtra;
  iVar3 = sqlite3PcachePagecount(pPager->pPCache);
  iVar4 = sqlite3MallocSize(pPager);
  return ((int)iVar2 + (uint)uVar1 + 0x78) * iVar3 + iVar4 + (int)pPager->pageSize;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerMemUsed(Pager *pPager){
  int perPageSize = pPager->pageSize + pPager->nExtra
    + (int)(sizeof(PgHdr) + 5*sizeof(void*));
  return perPageSize*sqlite3PcachePagecount(pPager->pPCache)
           + sqlite3MallocSize(pPager)
           + pPager->pageSize;
}